

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

BOOL __thiscall
Js::JavascriptRegExp::DeleteProperty
          (JavascriptRegExp *this,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *this_00;
  ThreadConfiguration *pTVar1;
  BOOL BVar2;
  PropertyRecord *pPVar3;
  
  this_00 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr;
  switch(propertyId) {
  case 0x1a1:
    break;
  case 0x1a2:
    propertyId = 0x1a2;
    goto LAB_00d083fe;
  case 0x1a4:
    pTVar1 = (this_00->config).threadConfig;
    if ((pTVar1->m_ES2018RegExDotAll == true) && (pTVar1->m_ES6RegExPrototypeProperties == false)) {
      propertyId = 0x1a4;
      goto LAB_00d083fe;
    }
    propertyId = 0x1a4;
    break;
  case 0x1a6:
    pTVar1 = (this_00->config).threadConfig;
    if ((pTVar1->m_ES6Unicode == true) && (pTVar1->m_ES6RegExPrototypeProperties == false)) {
      propertyId = 0x1a6;
      goto LAB_00d083fe;
    }
    propertyId = 0x1a6;
    break;
  case 0x1a7:
    pTVar1 = (this_00->config).threadConfig;
    if ((pTVar1->m_ES6RegExSticky == true) && (pTVar1->m_ES6RegExPrototypeProperties == false)) {
      propertyId = 0x1a7;
      goto LAB_00d083fe;
    }
    propertyId = 0x1a7;
    break;
  default:
    if ((propertyId != 0x153) && (propertyId != 0x1e0)) break;
  case 0x1a0:
  case 0x1a3:
  case 0x1a5:
    if (((this_00->config).threadConfig)->m_ES6RegExPrototypeProperties == false) {
LAB_00d083fe:
      pPVar3 = ScriptContext::GetPropertyName(this_00,propertyId);
      JavascriptError::ThrowCantDeleteIfStrictMode
                (propertyOperationFlags,this_00,(PCWSTR)(pPVar3 + 1));
      return 0;
    }
  }
  BVar2 = DynamicObject::DeleteProperty
                    (&this->super_DynamicObject,propertyId,propertyOperationFlags);
  return BVar2;
}

Assistant:

BOOL JavascriptRegExp::DeleteProperty(PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define DELETE_PROPERTY(ownProperty) \
        if (ownProperty) \
        { \
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), this->GetScriptContext()->GetPropertyName(propertyId)->GetBuffer()); \
            return false; \
        } \
        return DynamicObject::DeleteProperty(propertyId, propertyOperationFlags);

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            DELETE_PROPERTY(true);
        case PropertyIds::global:
        case PropertyIds::multiline:
        case PropertyIds::ignoreCase:
        case PropertyIds::source:
        case PropertyIds::options:
            DELETE_PROPERTY(!scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::dotAll:
            DELETE_PROPERTY(scriptConfig->IsES2018RegExDotAllEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::unicode:
            DELETE_PROPERTY(scriptConfig->IsES6UnicodeExtensionsEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        case PropertyIds::sticky:
            DELETE_PROPERTY(scriptConfig->IsES6RegExStickyEnabled() && !scriptConfig->IsES6RegExPrototypePropertiesEnabled());
        default:
            return DynamicObject::DeleteProperty(propertyId, propertyOperationFlags);
        }

#undef DELETE_PROPERTY
    }